

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * gl4cts::EnhancedLayouts::Utils::Variable::GetReference
                   (string *__return_storage_ptr__,string *parent_name,Descriptor *variable,
                   FLAVOUR flavour,GLuint array_index)

{
  ulong uVar1;
  char local_58 [8];
  GLchar buffer [16];
  GLuint array_index_local;
  FLAVOUR flavour_local;
  Descriptor *variable_local;
  string *parent_name_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)parent_name);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&variable->m_name);
  }
  if (flavour != BASIC) {
    if (flavour == ARRAY) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (flavour == INDEXED_BY_INVOCATION_ID) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if (variable->m_n_array_elements != 0) {
    sprintf(local_58,"%d",(ulong)array_index);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::GetReference(const std::string& parent_name, const Descriptor& variable, FLAVOUR flavour,
								   GLuint array_index)
{
	std::string name;

	/* Prepare name */
	if (false == parent_name.empty())
	{
		name = parent_name;
		name.append(".");
		name.append(variable.m_name);
	}
	else
	{
		name = variable.m_name;
	}

	/* */
	switch (flavour)
	{
	case Utils::Variable::BASIC:
		break;

	case Utils::Variable::ARRAY:
		name.append("[0]");
		break;

	case Utils::Variable::INDEXED_BY_INVOCATION_ID:
		name.append("[gl_InvocationID]");
		break;
	}

	/* Assumption that both variables have same lengths */
	if (0 != variable.m_n_array_elements)
	{
		GLchar buffer[16];
		sprintf(buffer, "%d", array_index);
		name.append("[");
		name.append(buffer);
		name.append("]");
	}

	return name;
}